

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O2

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
::PropagateIfThenResultIntoCondition<std::array<int,3ul>>
          (ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,array<int,_3UL> args,Context ctx)

{
  Context ctx_00;
  long lVar1;
  Context ctx_local;
  
  ctx_00.value_ = CTX_MIX;
  if ((ctx.value_ & ~CTX_ROOT) == CTX_POS) {
    lVar1 = args._M_elems._0_8_ >> 0x20;
    ctx_00.value_ = ctx.value_;
    if ((*(double *)(*(long *)(this + 0x40) + lVar1 * 8) <
         *(double *)(*(long *)(this + 0x58) + (long)args._M_elems[2] * 8)) &&
       (ctx_00.value_ = CTX_MIX,
       *(double *)(*(long *)(this + 0x58) + lVar1 * 8) <=
       *(double *)(*(long *)(this + 0x40) + (long)args._M_elems[2] * 8))) {
      ctx_00 = Context::operator-(&ctx_local);
    }
  }
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::PropagateResultOfInitExpr
            ((FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              *)this,args._M_elems[0],0.0,1.0,ctx_00);
  return;
}

Assistant:

void PropagateIfThenResultIntoCondition(Array3 args, Context ctx) {
    Context ctx_cond = Context::CTX_MIX;
    if (ctx.IsPositive() || ctx.IsNegative()) {
      if (MPCD( lb(args[1]) ) >= MPCD( ub(args[2]) ))
        ctx_cond = +ctx;
      else if (MPCD( lb(args[2]) ) >= MPCD( ub(args[1]) ))
        ctx_cond = -ctx;
    }
    MPD( PropagateResultOfInitExpr(args[0], 0.0, 1.0, ctx_cond) );
  }